

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O0

int nghttp2_http_on_response_headers(nghttp2_stream *stream)

{
  int iVar1;
  nghttp2_stream *in_RDI;
  int local_4;
  
  if ((in_RDI->http_flags & 0x20) == 0) {
    local_4 = -1;
  }
  else if ((int)in_RDI->status_code / 100 == 1) {
    in_RDI->http_flags = in_RDI->http_flags & 0x780 | 0x4000;
    in_RDI->content_length = -1;
    in_RDI->status_code = -1;
    local_4 = 0;
  }
  else {
    in_RDI->http_flags = in_RDI->http_flags & 0xffffbfff;
    iVar1 = expect_response_body(in_RDI);
    if (iVar1 == 0) {
      in_RDI->content_length = 0;
    }
    else if ((in_RDI->http_flags & 0x480) != 0) {
      in_RDI->content_length = -1;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int nghttp2_http_on_response_headers(nghttp2_stream *stream) {
  if ((stream->http_flags & NGHTTP2_HTTP_FLAG__STATUS) == 0) {
    return -1;
  }

  if (stream->status_code / 100 == 1) {
    /* non-final response */
    stream->http_flags = (stream->http_flags & NGHTTP2_HTTP_FLAG_METH_ALL) |
                         NGHTTP2_HTTP_FLAG_EXPECT_FINAL_RESPONSE;
    stream->content_length = -1;
    stream->status_code = -1;
    return 0;
  }

  stream->http_flags =
    stream->http_flags & (uint32_t)~NGHTTP2_HTTP_FLAG_EXPECT_FINAL_RESPONSE;

  if (!expect_response_body(stream)) {
    stream->content_length = 0;
  } else if (stream->http_flags & (NGHTTP2_HTTP_FLAG_METH_CONNECT |
                                   NGHTTP2_HTTP_FLAG_METH_UPGRADE_WORKAROUND)) {
    stream->content_length = -1;
  }

  return 0;
}